

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O0

_Bool roaring64_bitmap_remove_checked(roaring64_bitmap_t *r,uint64_t val)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  art_val_t *paVar4;
  roaring64_bitmap_t *r_00;
  container_t *c;
  undefined8 in_RSI;
  leaf_t *in_RDI;
  int new_cardinality;
  int old_cardinality;
  leaf_t *leaf;
  uint16_t low16;
  uint8_t high48 [6];
  art_t *art;
  art_t *in_stack_ffffffffffffffb8;
  roaring64_bitmap_t *in_stack_ffffffffffffffc0;
  uint16_t low16_00;
  leaf_t *high48_00;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar5;
  
  low16_00 = (uint16_t)((ulong)in_RSI >> 0x30);
  high48_00 = in_RDI;
  split_key((uint64_t)in_stack_ffffffffffffffc0,(uint8_t *)in_stack_ffffffffffffffb8);
  paVar4 = art_find(in_stack_ffffffffffffffb8,(art_key_chunk_t *)0x11e0bb);
  if (paVar4 == (art_val_t *)0x0) {
    bVar5 = false;
  }
  else {
    r_00 = (roaring64_bitmap_t *)
           get_container(in_stack_ffffffffffffffc0,(leaf_t)in_stack_ffffffffffffffb8);
    get_typecode(*paVar4);
    iVar2 = container_get_cardinality(in_stack_ffffffffffffffb8,'\0');
    _Var1 = containerptr_roaring64_bitmap_remove
                      ((roaring64_bitmap_t *)
                       CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                       (uint8_t *)high48_00,low16_00,in_RDI);
    if (_Var1) {
      bVar5 = true;
    }
    else {
      c = get_container(r_00,(leaf_t)in_stack_ffffffffffffffb8);
      get_typecode(*paVar4);
      iVar3 = container_get_cardinality(c,'\0');
      bVar5 = iVar3 != iVar2;
    }
  }
  return bVar5;
}

Assistant:

bool roaring64_bitmap_remove_checked(roaring64_bitmap_t *r, uint64_t val) {
    art_t *art = &r->art;
    uint8_t high48[ART_KEY_BYTES];
    uint16_t low16 = split_key(val, high48);
    leaf_t *leaf = (leaf_t *)art_find(art, high48);

    if (leaf == NULL) {
        return false;
    }
    int old_cardinality =
        container_get_cardinality(get_container(r, *leaf), get_typecode(*leaf));
    if (containerptr_roaring64_bitmap_remove(r, high48, low16, leaf)) {
        return true;
    }
    int new_cardinality =
        container_get_cardinality(get_container(r, *leaf), get_typecode(*leaf));
    return new_cardinality != old_cardinality;
}